

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::push(CTcTokenizer *this,CTcToken *tok)

{
  CTcTokenEle *pCVar1;
  CTcTokenEle *pCVar2;
  
  pCVar2 = this->unget_head_;
  if (pCVar2 == (CTcTokenEle *)0x0) {
    pCVar2 = (CTcTokenEle *)operator_new(0x38);
    pCVar2->nxt_ = (CTcTokenEle *)0x0;
    pCVar2->prv_ = (CTcTokenEle *)0x0;
    this->unget_head_ = pCVar2;
  }
  pCVar1 = this->unget_cur_;
  if ((pCVar1 != (CTcTokenEle *)0x0) && (pCVar2 = pCVar1->nxt_, pCVar2 == (CTcTokenEle *)0x0)) {
    pCVar2 = (CTcTokenEle *)operator_new(0x38);
    pCVar2->nxt_ = (CTcTokenEle *)0x0;
    pCVar1->nxt_ = pCVar2;
    pCVar2->prv_ = this->unget_cur_;
  }
  this->unget_cur_ = pCVar2;
  (pCVar2->super_CTcToken).typ_ = tok->typ_;
  (pCVar2->super_CTcToken).text_ = tok->text_;
  (pCVar2->super_CTcToken).text_len_ = tok->text_len_;
  (pCVar2->super_CTcToken).int_val_ = tok->int_val_;
  (pCVar2->super_CTcToken).field_0x20 =
       (pCVar2->super_CTcToken).field_0x20 & 0xfe | tok->field_0x20 & 1;
  return;
}

Assistant:

void CTcTokenizer::push(const CTcToken *tok)
{
    /* if the unget list is empty, create the initial entry */
    if (unget_head_ == 0)
        unget_head_ = new CTcTokenEle();

    /* advance to the next slot in the list */
    if (unget_cur_ == 0)
    {
        /* no last ungot token - set up at the head of the list */
        unget_cur_ = unget_head_;
    }
    else if (unget_cur_->getnxt() != 0)
    {
        /* there's another slot available - advance to it */
        unget_cur_ = unget_cur_->getnxt();
    }
    else
    {
        /* the list is full - we need to allocate a new slot */
        CTcTokenEle *newele = new CTcTokenEle();

        /* link it at the end of the list */
        unget_cur_->setnxt(newele);
        newele->setprv(unget_cur_);

        /* advance to it */
        unget_cur_ = newele;
    }

    /* save the pushed token */
    unget_cur_->set(*tok);
}